

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O0

void * priority_queue_poll(priority_queue_t *queue)

{
  int iVar1;
  void *res;
  size_t i;
  priority_queue_t *queue_local;
  
  if (queue->size == 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/priority_queue.c"
            ,0x4c,"Trying to poll from empty queue\n");
    queue_local = (priority_queue_t *)0x0;
  }
  else if (queue->max_element == (void *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/priority_queue.c"
            ,0x50,"Trying to poll from queue and max element is undefined\n");
    queue_local = (priority_queue_t *)0x0;
  }
  else {
    queue_local = (priority_queue_t *)queue->max_element;
    for (res = (void *)0x0; res < (void *)queue->alloc_size; res = (void *)((long)res + 1)) {
      if (queue->pointers[(long)res] == queue->max_element) {
        queue->pointers[(long)res] = (void *)0x0;
        break;
      }
    }
    queue->max_element = (void *)0x0;
    for (res = (void *)0x0; res < (void *)queue->alloc_size; res = (void *)((long)res + 1)) {
      if (queue->pointers[(long)res] != (void *)0x0) {
        if (queue->max_element == (void *)0x0) {
          queue->max_element = queue->pointers[(long)res];
        }
        else {
          iVar1 = (*queue->compare)(queue->pointers[(long)res],queue->max_element);
          if (iVar1 < 0) {
            queue->max_element = queue->pointers[(long)res];
          }
        }
      }
    }
    queue->size = queue->size - 1;
  }
  return queue_local;
}

Assistant:

void* priority_queue_poll(priority_queue_t *queue)
{
    
    size_t i;
    void *res;

    if (queue->size == 0) {
        E_WARN("Trying to poll from empty queue\n");
        return NULL;
    }
    if (queue->max_element == NULL) {
        E_ERROR("Trying to poll from queue and max element is undefined\n");
        return NULL;
    }
    res = queue->max_element;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == queue->max_element) {
            queue->pointers[i] = NULL;
            break;
        }
    }
    queue->max_element = NULL;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == 0)
            continue;
        if (queue->max_element == NULL) {
            queue->max_element = queue->pointers[i];
        } else {
            if (queue->compare(queue->pointers[i], queue->max_element) < 0)
                queue->max_element = queue->pointers[i];
        }
    }
    queue->size--;
    return res;
}